

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all.cpp
# Opt level: O0

void test_assignment_out(void)

{
  size_t __size;
  void *__ptr;
  runtime_error *prVar1;
  float local_88 [2];
  float score_graph [16];
  int connections [8];
  void *workspace;
  size_t workspace_size;
  float score_threshold;
  int count_b;
  int count_a;
  int M;
  
  __size = trt_pose::parse::assignment_out_workspace(4);
  __ptr = malloc(__size);
  memcpy(local_88,&DAT_00102100,0x40);
  trt_pose::parse::assignment_out((int *)(score_graph + 0xe),local_88,3,3,4,0.3,__ptr);
  if (score_graph[0xe] != 1.4013e-45) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"connections[0] should be 1.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (score_graph[0xf] != 0.0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"connections[0] should be 1.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (connections[0] != 2) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"connections[0] should be 1.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  free(__ptr);
  return;
}

Assistant:

void test_assignment_out()
{
  const int M = 4;
  const int count_a = 3;
  const int count_b = 3;
  const float score_threshold = 0.3;
  
  std::size_t workspace_size = assignment_out_workspace(M);
  void *workspace = (void *) malloc(workspace_size);

  int connections[2 * M];
  const float score_graph[M * M] = {
    1., 3., 0., 0.,
    1., 2., 1., 0.,
    4., 3., 4., 0.,
    0., 0., 0., 0.,
  };

  assignment_out(connections, score_graph, count_a, count_b, M, score_threshold, workspace);

  if (connections[0] != 1) {
    throw std::runtime_error("connections[0] should be 1.");
  }
  if (connections[1] != 0) {
    throw std::runtime_error("connections[0] should be 1.");
  }
  if (connections[2] != 2) {
    throw std::runtime_error("connections[0] should be 1.");
  }

  free(workspace);
}